

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O0

void ll_ftp_new_file_initialize(ll_ftp_t *f,ll_ftp_msg_t *msg)

{
  uint16_t uVar1;
  double dVar2;
  uint16_t len;
  ll_ftp_msg_t *msg_local;
  ll_ftp_t *f_local;
  
  ll_ftp_reset(f);
  f->file_id = msg->file_id;
  f->file_version = msg->file_version;
  f->file_size = msg->file_size;
  dVar2 = ceil((double)f->file_size / 107.0);
  f->num_segs = (uint16_t)(int)dVar2;
  memset(f->rx_segs,0,0x4cc);
  uVar1 = ll_ftp_ack_init_generate(f,true);
  ll_ftp_send_uplink(f,(ulong)uVar1);
  return;
}

Assistant:

static void ll_ftp_new_file_initialize(ll_ftp_t* f, ll_ftp_msg_t* msg)
{
    ll_ftp_reset(f);
    f->file_id = msg->file_id;
    f->file_version = msg->file_version;
    f->file_size = msg->file_size;
    f->num_segs = (uint16_t)ceil((double)f->file_size / (double)MAX_FILE_SEGMENT_BYTES);
    memset(f->rx_segs, 0, sizeof(f->rx_segs[0]) * NUM_RX_SEGS_BITMASK);

    // send ACK_INIT
    uint16_t len = ll_ftp_ack_init_generate(f, true);
    ll_ftp_send_uplink(f, len);
}